

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

void Llb_ManFlowGetObjSet(Aig_Man_t *p,Vec_Ptr_t *vLower,int iStart,int nSize,Vec_Ptr_t *vSet)

{
  size_t __size;
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  void **ppvVar4;
  int iVar5;
  
  vSet->nSize = 0;
  if (0 < nSize) {
    iVar5 = 0;
    do {
      uVar3 = (long)iStart % (long)vLower->nSize;
      if ((int)(vLower->nSize | (uint)uVar3) < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = vLower->pArray[uVar3 & 0xffffffff];
      if (iVar5 == vSet->nCap) {
        if (iVar5 < 0x10) {
          if (vSet->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vSet->pArray,0x80);
          }
          vSet->pArray = ppvVar4;
          vSet->nCap = 0x10;
        }
        else {
          __size = (ulong)(uint)(iVar5 * 2) * 8;
          if (vSet->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(__size);
          }
          else {
            ppvVar4 = (void **)realloc(vSet->pArray,__size);
          }
          vSet->pArray = ppvVar4;
          vSet->nCap = iVar5 * 2;
        }
      }
      else {
        ppvVar4 = vSet->pArray;
      }
      iVar1 = vSet->nSize;
      iVar5 = iVar1 + 1;
      vSet->nSize = iVar5;
      ppvVar4[iVar1] = pvVar2;
      iStart = iStart + 1;
      nSize = nSize + -1;
    } while (nSize != 0);
  }
  return;
}

Assistant:

void Llb_ManFlowGetObjSet( Aig_Man_t * p, Vec_Ptr_t * vLower, int iStart, int nSize, Vec_Ptr_t * vSet )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vSet );
    for ( i = 0; i < nSize; i++ )
    {
        pObj = (Aig_Obj_t *)Vec_PtrEntry( vLower, (iStart + i) % Vec_PtrSize(vLower) );
        Vec_PtrPush( vSet, pObj );
    }
}